

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fTextureFormatTests.cpp
# Opt level: O0

void __thiscall
deqp::gles3::Functional::CompressedCubeFormatCase::CompressedCubeFormatCase
          (CompressedCubeFormatCase *this,TestContext *testCtx,RenderContext *renderCtx,
          ContextInfo *renderCtxInfo,char *name,char *description,CompressedTexFormat format,
          deUint32 randomSeed,int width,int height)

{
  TestLog *log;
  char *description_local;
  char *name_local;
  ContextInfo *renderCtxInfo_local;
  RenderContext *renderCtx_local;
  TestContext *testCtx_local;
  CompressedCubeFormatCase *this_local;
  
  tcu::TestCase::TestCase(&this->super_TestCase,testCtx,name,description);
  (this->super_TestCase).super_TestNode._vptr_TestNode =
       (_func_int **)&PTR__CompressedCubeFormatCase_0329b5d8;
  this->m_renderCtx = renderCtx;
  this->m_renderCtxInfo = renderCtxInfo;
  this->m_format = format;
  this->m_randomSeed = randomSeed;
  this->m_width = width;
  this->m_height = height;
  this->m_texture = (TextureCube *)0x0;
  log = tcu::TestContext::getLog(testCtx);
  deqp::gls::TextureTestUtil::TextureRenderer::TextureRenderer
            (&this->m_renderer,renderCtx,log,GLSL_VERSION_300_ES,PRECISION_HIGHP);
  this->m_curFace = 0;
  this->m_isOk = false;
  return;
}

Assistant:

CompressedCubeFormatCase::CompressedCubeFormatCase (tcu::TestContext&			testCtx,
													glu::RenderContext&			renderCtx,
													const glu::ContextInfo&		renderCtxInfo,
													const char*					name,
													const char*					description,
													tcu::CompressedTexFormat	format,
													deUint32					randomSeed,
													int							width,
													int							height)
	: TestCase			(testCtx, name, description)
	, m_renderCtx		(renderCtx)
	, m_renderCtxInfo	(renderCtxInfo)
	, m_format			(format)
	, m_randomSeed		(randomSeed)
	, m_width			(width)
	, m_height			(height)
	, m_texture			(DE_NULL)
	, m_renderer		(renderCtx, testCtx.getLog(), glu::GLSL_VERSION_300_ES, glu::PRECISION_HIGHP)
	, m_curFace			(0)
	, m_isOk			(false)
{
}